

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

void __thiscall
tchecker::typed_local_var_statement_t::typed_local_var_statement_t
          (typed_local_var_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_var_expression_t> *variable,
          shared_ptr<const_tchecker::typed_expression_t> *init)

{
  shared_ptr<const_tchecker::expression_t> local_48;
  shared_ptr<const_tchecker::var_expression_t> local_38;
  shared_ptr<const_tchecker::typed_expression_t> *local_28;
  shared_ptr<const_tchecker::typed_expression_t> *init_local;
  shared_ptr<const_tchecker::typed_var_expression_t> *variable_local;
  typed_local_var_statement_t *ptStack_10;
  statement_type_t type_local;
  typed_local_var_statement_t *this_local;
  
  local_28 = init;
  init_local = (shared_ptr<const_tchecker::typed_expression_t> *)variable;
  variable_local._4_4_ = type;
  ptStack_10 = this;
  statement_t::statement_t((statement_t *)this);
  typed_statement_t::typed_statement_t
            (&this->super_typed_statement_t,&PTR_PTR_00427bb8,variable_local._4_4_);
  std::shared_ptr<tchecker::var_expression_t_const>::
  shared_ptr<tchecker::typed_var_expression_t_const,void>
            ((shared_ptr<tchecker::var_expression_t_const> *)&local_38,
             (shared_ptr<const_tchecker::typed_var_expression_t> *)init_local);
  std::shared_ptr<tchecker::expression_t_const>::shared_ptr<tchecker::typed_expression_t_const,void>
            ((shared_ptr<tchecker::expression_t_const> *)&local_48,local_28);
  local_var_statement_t::local_var_statement_t
            (&this->super_local_var_statement_t,&PTR_construction_vtable_56__00427bc8,&local_38,
             &local_48);
  std::shared_ptr<const_tchecker::expression_t>::~shared_ptr(&local_48);
  std::shared_ptr<const_tchecker::var_expression_t>::~shared_ptr(&local_38);
  *(undefined8 *)&this->super_typed_statement_t = 0x427b10;
  *(undefined8 *)&this->super_typed_statement_t = 0x427b10;
  *(undefined8 *)&this->super_local_var_statement_t = 0x427b80;
  return;
}

Assistant:

typed_local_var_statement_t::typed_local_var_statement_t(
    enum tchecker::statement_type_t type, std::shared_ptr<tchecker::typed_var_expression_t const> const & variable,
    std::shared_ptr<tchecker::typed_expression_t const> const & init)
    : tchecker::typed_statement_t(type), tchecker::local_var_statement_t(variable, init)
{
}